

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

void __thiscall glslang::TBuiltInParseablesHlsl::createMatTimesMat(TBuiltInParseablesHlsl *this)

{
  TString *s_00;
  int retCols;
  int retRows;
  int yCols;
  int yRows;
  int xCols;
  int xRows;
  TString *s;
  TBuiltInParseablesHlsl *this_local;
  
  s_00 = &(this->super_TBuiltInParseables).commonBuiltins;
  for (yRows = 1; yRows < 5; yRows = yRows + 1) {
    for (yCols = 1; yCols < 5; yCols = yCols + 1) {
      for (retCols = 1; retCols < 5; retCols = retCols + 1) {
        anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"M","F",yRows,retCols);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s_00," ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s_00,"mul");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s_00,"(");
        anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"M","F",yRows,yCols);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s_00,", ");
        anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"M","F",yCols,retCols);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s_00,");\n");
      }
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"V","F",yRows,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,"mul");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,"(");
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"M","F",yRows,yCols);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,", ");
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"V","F",yCols,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,");\n");
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"V","F",yCols,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,"mul");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,"(");
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"V","F",yRows,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,", ");
      anon_unknown.dwarf_aa9bcd::AppendTypeName(s_00,"M","F",yRows,yCols);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s_00,");\n");
    }
  }
  return;
}

Assistant:

void TBuiltInParseablesHlsl::createMatTimesMat()
{
    TString& s = commonBuiltins;

    for (int xRows = 1; xRows <=4; xRows++) {
        for (int xCols = 1; xCols <=4; xCols++) {
            const int yRows = xCols;
            for (int yCols = 1; yCols <=4; yCols++) {
                const int retRows = xRows;
                const int retCols = yCols;

                // Create a mat * mat of the appropriate dimensions
                AppendTypeName(s, "M", "F", retRows, retCols);  // add return type
                s.append(" ");                                  // space between type and name
                s.append("mul");                                // intrinsic name
                s.append("(");                                  // open paren

                AppendTypeName(s, "M", "F", xRows, xCols);      // add X input
                s.append(", ");
                AppendTypeName(s, "M", "F", yRows, yCols);      // add Y input

                s.append(");\n");                               // close paren
            }

            // Create M*V
            AppendTypeName(s, "V", "F", xRows, 1);          // add return type
            s.append(" ");                                  // space between type and name
            s.append("mul");                                // intrinsic name
            s.append("(");                                  // open paren

            AppendTypeName(s, "M", "F", xRows, xCols);      // add X input
            s.append(", ");
            AppendTypeName(s, "V", "F", xCols, 1);          // add Y input

            s.append(");\n");                               // close paren

            // Create V*M
            AppendTypeName(s, "V", "F", xCols, 1);          // add return type
            s.append(" ");                                  // space between type and name
            s.append("mul");                                // intrinsic name
            s.append("(");                                  // open paren

            AppendTypeName(s, "V", "F", xRows, 1);          // add Y input
            s.append(", ");
            AppendTypeName(s, "M", "F", xRows, xCols);      // add X input

            s.append(");\n");                               // close paren
        }
    }
}